

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O2

void test_convert<int,short>(uint length,int value)

{
  int *piVar1;
  short *__p;
  long lVar2;
  undefined8 *puVar3;
  int iVar4;
  ulong uVar5;
  int *local_40;
  shared_ptr<int> pt;
  shared_ptr<short> pu;
  
  piVar1 = nosimd::common::malloc<int>(length);
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void(*)(int*),void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&local_40,piVar1,
             nosimd::common::free<int>);
  __p = nosimd::common::malloc<short>(length);
  std::__shared_ptr<short,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<short,void(*)(short*),void>
            ((__shared_ptr<short,(__gnu_cxx::_Lock_policy)2> *)
             &pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p,
             nosimd::common::free<short>);
  piVar1 = local_40;
  for (iVar4 = (int)length >> 2; 3 < iVar4; iVar4 = iVar4 + -4) {
    *piVar1 = value;
    piVar1[1] = value;
    piVar1[2] = value;
    piVar1[3] = value;
    piVar1[4] = value;
    piVar1[5] = value;
    piVar1[6] = value;
    piVar1[7] = value;
    piVar1[8] = value;
    piVar1[9] = value;
    piVar1[10] = value;
    piVar1[0xb] = value;
    piVar1[0xc] = value;
    piVar1[0xd] = value;
    piVar1[0xe] = value;
    piVar1[0xf] = value;
    piVar1 = piVar1 + 0x10;
  }
  if (1 < iVar4) {
    *piVar1 = value;
    piVar1[1] = value;
    piVar1[2] = value;
    piVar1[3] = value;
    piVar1[4] = value;
    piVar1[5] = value;
    piVar1[6] = value;
    piVar1[7] = value;
    iVar4 = iVar4 + -2;
    piVar1 = piVar1 + 8;
  }
  if (iVar4 != 0) {
    *piVar1 = value;
    piVar1[1] = value;
    piVar1[2] = value;
    piVar1[3] = value;
  }
  for (lVar2 = (long)(int)(length & 0xfffffffc); lVar2 < (int)length; lVar2 = lVar2 + 1) {
    local_40[lVar2] = value;
  }
  nosimd::common::convert<int,short>
            (local_40,(short *)pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                               _M_pi,length);
  uVar5 = 0;
  do {
    if (length == uVar5) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt);
      return;
    }
    lVar2 = uVar5 * 2;
    uVar5 = uVar5 + 1;
  } while (*(short *)((long)&(pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base + lVar2) == (short)value);
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar3 = "void test_convert(unsigned int, _T) [_T = int, _U = short]";
  *(undefined4 *)(puVar3 + 1) = 0x17;
  *(uint *)((long)puVar3 + 0xc) = length;
  __cxa_throw(puVar3,&Exception::typeinfo,0);
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}